

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS
ref_part_bin_ugrid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename,REF_BOOL swap_endian,
                  REF_BOOL sixty_four_bit)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  char *yp_13;
  char *xp_13;
  int y_13;
  char *yp_12;
  char *xp_12;
  int y_12;
  char *yp_11;
  char *xp_11;
  int y_11;
  char *yp_10;
  char *xp_10;
  int y_10;
  char *yp_9;
  char *xp_9;
  int y_9;
  char *yp_8;
  char *xp_8;
  int y_8;
  char *yp_7;
  char *xp_7;
  int y_7;
  char *yp_6;
  char *xp_6;
  long y_6;
  char *yp_5;
  char *xp_5;
  long y_5;
  char *yp_4;
  char *xp_4;
  long y_4;
  char *yp_3;
  char *xp_3;
  long y_3;
  char *yp_2;
  char *xp_2;
  long y_2;
  char *yp_1;
  char *xp_1;
  long y_1;
  char *yp;
  char *xp;
  long y;
  REF_STATUS ref_private_macro_code_rss;
  REF_FILEPOS ibyte;
  uint local_98;
  REF_INT single;
  REF_BOOL instrument;
  REF_INT version;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_FILEPOS faceid_offset;
  REF_FILEPOS conn_offset;
  REF_LONG nhex;
  REF_LONG npri;
  REF_LONG npyr;
  REF_LONG ntet;
  REF_LONG nqua;
  REF_LONG ntri;
  REF_LONG nnode;
  FILE *file;
  REF_BOOL sixty_four_bit_local;
  REF_BOOL swap_endian_local;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  single = 0;
  local_98 = (uint)(0 < ref_mpi->timing);
  iVar2 = 4;
  if (sixty_four_bit != 0) {
    iVar2 = 8;
  }
  lVar3 = (long)iVar2;
  file._0_4_ = sixty_four_bit;
  file._4_4_ = swap_endian;
  _sixty_four_bit_local = filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x53f,
           "ref_part_bin_ugrid",(ulong)uVar1,"create grid");
    return uVar1;
  }
  ref_node = *(REF_NODE *)ref_mpi_local;
  _instrument = *(REF_NODE *)&ref_node->blank;
  if (local_98 != 0) {
    ref_mpi_stopwatch_start(*(REF_MPI *)ref_node);
  }
  nnode = 0;
  if (*(int *)(*(long *)ref_node + 4) == 0) {
    nnode = (REF_LONG)fopen(_sixty_four_bit_local,"r");
    if ((FILE *)nnode == (FILE *)0x0) {
      printf("unable to open %s\n",_sixty_four_bit_local);
    }
    if (nnode == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x54b,
             "ref_part_bin_ugrid","unable to open file");
      return 2;
    }
    if ((REF_BOOL)file == 0) {
      sVar4 = fread((void *)((long)&ibyte + 4),4,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x560,"ref_part_bin_ugrid","nnode");
        return 1;
      }
      if (file._4_4_ != 0) {
        xp_7._7_1_ = ibyte._4_1_;
        xp_7._6_1_ = ibyte._5_1_;
        xp_7._5_1_ = ibyte._6_1_;
        xp_7._4_1_ = ibyte._7_1_;
        ibyte._4_4_ = xp_7._4_4_;
      }
      ntri = (REF_LONG)ibyte._4_4_;
      sVar4 = fread((void *)((long)&ibyte + 4),4,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x563,"ref_part_bin_ugrid","ntri");
        return 1;
      }
      if (file._4_4_ != 0) {
        xp_8._7_1_ = ibyte._4_1_;
        xp_8._6_1_ = ibyte._5_1_;
        xp_8._5_1_ = ibyte._6_1_;
        xp_8._4_1_ = ibyte._7_1_;
        ibyte._4_4_ = xp_8._4_4_;
      }
      nqua = (REF_LONG)ibyte._4_4_;
      sVar4 = fread((void *)((long)&ibyte + 4),4,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x566,"ref_part_bin_ugrid","nqua");
        return 1;
      }
      if (file._4_4_ != 0) {
        xp_9._7_1_ = ibyte._4_1_;
        xp_9._6_1_ = ibyte._5_1_;
        xp_9._5_1_ = ibyte._6_1_;
        xp_9._4_1_ = ibyte._7_1_;
        ibyte._4_4_ = xp_9._4_4_;
      }
      ntet = (REF_LONG)ibyte._4_4_;
      sVar4 = fread((void *)((long)&ibyte + 4),4,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x569,"ref_part_bin_ugrid","ntet");
        return 1;
      }
      if (file._4_4_ != 0) {
        xp_10._7_1_ = ibyte._4_1_;
        xp_10._6_1_ = ibyte._5_1_;
        xp_10._5_1_ = ibyte._6_1_;
        xp_10._4_1_ = ibyte._7_1_;
        ibyte._4_4_ = xp_10._4_4_;
      }
      npyr = (REF_LONG)ibyte._4_4_;
      sVar4 = fread((void *)((long)&ibyte + 4),4,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x56c,"ref_part_bin_ugrid","npyr");
        return 1;
      }
      if (file._4_4_ != 0) {
        xp_11._7_1_ = ibyte._4_1_;
        xp_11._6_1_ = ibyte._5_1_;
        xp_11._5_1_ = ibyte._6_1_;
        xp_11._4_1_ = ibyte._7_1_;
        ibyte._4_4_ = xp_11._4_4_;
      }
      npri = (REF_LONG)ibyte._4_4_;
      sVar4 = fread((void *)((long)&ibyte + 4),4,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x56f,"ref_part_bin_ugrid","npri");
        return 1;
      }
      if (file._4_4_ != 0) {
        xp_12._7_1_ = ibyte._4_1_;
        xp_12._6_1_ = ibyte._5_1_;
        xp_12._5_1_ = ibyte._6_1_;
        xp_12._4_1_ = ibyte._7_1_;
        ibyte._4_4_ = xp_12._4_4_;
      }
      nhex = (REF_LONG)ibyte._4_4_;
      sVar4 = fread((void *)((long)&ibyte + 4),4,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x572,"ref_part_bin_ugrid","nhex");
        return 1;
      }
      if (file._4_4_ != 0) {
        xp_13._7_1_ = ibyte._4_1_;
        xp_13._6_1_ = ibyte._5_1_;
        xp_13._5_1_ = ibyte._6_1_;
        xp_13._4_1_ = ibyte._7_1_;
        ibyte._4_4_ = xp_13._4_4_;
      }
      conn_offset = (REF_FILEPOS)ibyte._4_4_;
    }
    else {
      sVar4 = fread(&ntri,8,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x54e,"ref_part_bin_ugrid","nnode");
        return 1;
      }
      sVar4 = fread(&nqua,8,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x54f,"ref_part_bin_ugrid","ntri");
        return 1;
      }
      sVar4 = fread(&ntet,8,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x550,"ref_part_bin_ugrid","nqua");
        return 1;
      }
      sVar4 = fread(&npyr,8,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x551,"ref_part_bin_ugrid","ntet");
        return 1;
      }
      sVar4 = fread(&npri,8,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x552,"ref_part_bin_ugrid","npyr");
        return 1;
      }
      sVar4 = fread(&nhex,8,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x553,"ref_part_bin_ugrid","npri");
        return 1;
      }
      sVar4 = fread(&conn_offset,8,1,(FILE *)nnode);
      if (sVar4 != 1) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x554,"ref_part_bin_ugrid","nhex");
        return 1;
      }
      if (file._4_4_ != 0) {
        xp._7_1_ = (undefined1)ntri;
        xp._6_1_ = ntri._1_1_;
        xp._5_1_ = ntri._2_1_;
        xp._4_1_ = ntri._3_1_;
        xp._3_1_ = ntri._4_1_;
        xp._2_1_ = ntri._5_1_;
        xp._1_1_ = ntri._6_1_;
        xp._0_1_ = ntri._7_1_;
        ntri = (REF_LONG)xp;
        xp_1._7_1_ = (undefined1)nqua;
        xp_1._6_1_ = nqua._1_1_;
        xp_1._5_1_ = nqua._2_1_;
        xp_1._4_1_ = nqua._3_1_;
        xp_1._3_1_ = nqua._4_1_;
        xp_1._2_1_ = nqua._5_1_;
        xp_1._1_1_ = nqua._6_1_;
        xp_1._0_1_ = nqua._7_1_;
        nqua = (REF_LONG)xp_1;
        xp_2._7_1_ = (undefined1)ntet;
        xp_2._6_1_ = ntet._1_1_;
        xp_2._5_1_ = ntet._2_1_;
        xp_2._4_1_ = ntet._3_1_;
        xp_2._3_1_ = ntet._4_1_;
        xp_2._2_1_ = ntet._5_1_;
        xp_2._1_1_ = ntet._6_1_;
        xp_2._0_1_ = ntet._7_1_;
        ntet = (REF_LONG)xp_2;
        xp_3._7_1_ = (undefined1)npyr;
        xp_3._6_1_ = npyr._1_1_;
        xp_3._5_1_ = npyr._2_1_;
        xp_3._4_1_ = npyr._3_1_;
        xp_3._3_1_ = npyr._4_1_;
        xp_3._2_1_ = npyr._5_1_;
        xp_3._1_1_ = npyr._6_1_;
        xp_3._0_1_ = npyr._7_1_;
        npyr = (REF_LONG)xp_3;
        xp_4._7_1_ = (undefined1)npri;
        xp_4._6_1_ = npri._1_1_;
        xp_4._5_1_ = npri._2_1_;
        xp_4._4_1_ = npri._3_1_;
        xp_4._3_1_ = npri._4_1_;
        xp_4._2_1_ = npri._5_1_;
        xp_4._1_1_ = npri._6_1_;
        xp_4._0_1_ = npri._7_1_;
        npri = (REF_LONG)xp_4;
        xp_5._7_1_ = (undefined1)nhex;
        xp_5._6_1_ = nhex._1_1_;
        xp_5._5_1_ = nhex._2_1_;
        xp_5._4_1_ = nhex._3_1_;
        xp_5._3_1_ = nhex._4_1_;
        xp_5._2_1_ = nhex._5_1_;
        xp_5._1_1_ = nhex._6_1_;
        xp_5._0_1_ = nhex._7_1_;
        nhex = (REF_LONG)xp_5;
        xp_6._7_1_ = (undefined1)conn_offset;
        xp_6._6_1_ = conn_offset._1_1_;
        xp_6._5_1_ = conn_offset._2_1_;
        xp_6._4_1_ = conn_offset._3_1_;
        xp_6._3_1_ = conn_offset._4_1_;
        xp_6._2_1_ = conn_offset._5_1_;
        xp_6._1_1_ = conn_offset._6_1_;
        xp_6._0_1_ = conn_offset._7_1_;
        conn_offset = (REF_FILEPOS)xp_6;
      }
    }
  }
  uVar1 = ref_mpi_bcast(*(REF_MPI *)ref_node,&ntri,1,2);
  if (uVar1 == 0) {
    uVar1 = ref_mpi_bcast(*(REF_MPI *)ref_node,&nqua,1,2);
    if (uVar1 == 0) {
      uVar1 = ref_mpi_bcast(*(REF_MPI *)ref_node,&ntet,1,2);
      if (uVar1 == 0) {
        uVar1 = ref_mpi_bcast(*(REF_MPI *)ref_node,&npyr,1,2);
        if (uVar1 == 0) {
          uVar1 = ref_mpi_bcast(*(REF_MPI *)ref_node,&npri,1,2);
          if (uVar1 == 0) {
            uVar1 = ref_mpi_bcast(*(REF_MPI *)ref_node,&nhex,1,2);
            if (uVar1 == 0) {
              uVar1 = ref_mpi_bcast(*(REF_MPI *)ref_node,&conn_offset,1,2);
              if (uVar1 == 0) {
                if (local_98 != 0) {
                  ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid header");
                }
                uVar1 = ref_part_node((FILE *)nnode,file._4_4_,single,0,_instrument,ntri);
                if (uVar1 == 0) {
                  if (local_98 != 0) {
                    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid nodes");
                  }
                  if (0 < nqua) {
                    faceid_offset = lVar3 * 7 + ntri * 0x18;
                    ref_grid = (REF_GRID)
                               (lVar3 * 7 + ntri * 0x18 + nqua * 3 * lVar3 + ntet * 4 * lVar3);
                    uVar1 = ref_part_bin_ugrid_cell
                                      ((REF_CELL)ref_node->part,nqua,_instrument,ntri,(FILE *)nnode,
                                       faceid_offset,(REF_FILEPOS)ref_grid,file._4_4_,(REF_BOOL)file
                                      );
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x58f,"ref_part_bin_ugrid",(ulong)uVar1,"tri");
                      return uVar1;
                    }
                  }
                  if (0 < ntet) {
                    faceid_offset = lVar3 * 7 + ntri * 0x18 + nqua * 3 * lVar3;
                    ref_grid = (REF_GRID)
                               (lVar3 * 7 + ntri * 0x18 + nqua * 4 * lVar3 + ntet * 4 * lVar3);
                    uVar1 = ref_part_bin_ugrid_cell
                                      (*(REF_CELL *)&ref_node->naux,ntet,_instrument,ntri,
                                       (FILE *)nnode,faceid_offset,(REF_FILEPOS)ref_grid,file._4_4_,
                                       (REF_BOOL)file);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x59b,"ref_part_bin_ugrid",(ulong)uVar1,"qua");
                      return uVar1;
                    }
                  }
                  if (local_98 != 0) {
                    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid bound");
                  }
                  if (0 < npyr) {
                    faceid_offset = lVar3 * 7 + ntri * 0x18 + nqua * 4 * lVar3 + ntet * 5 * lVar3;
                    ref_grid = (REF_GRID)0xffffffffffffffff;
                    uVar1 = ref_part_bin_ugrid_cell
                                      ((REF_CELL)ref_node->ref_mpi,npyr,_instrument,ntri,
                                       (FILE *)nnode,faceid_offset,-1,file._4_4_,(REF_BOOL)file);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x5a7,"ref_part_bin_ugrid",(ulong)uVar1,"tet");
                      return uVar1;
                    }
                  }
                  if (local_98 != 0) {
                    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid tet");
                  }
                  if (0 < npri) {
                    faceid_offset =
                         lVar3 * 7 + ntri * 0x18 + nqua * 4 * lVar3 + ntet * 5 * lVar3 +
                         npyr * 4 * lVar3;
                    ref_grid = (REF_GRID)0xffffffffffffffff;
                    uVar1 = ref_part_bin_ugrid_cell
                                      (*(REF_CELL *)&ref_node->n_unused,npri,_instrument,ntri,
                                       (FILE *)nnode,faceid_offset,-1,file._4_4_,(REF_BOOL)file);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x5b3,"ref_part_bin_ugrid",(ulong)uVar1,"pyr");
                      return uVar1;
                    }
                  }
                  if (local_98 != 0) {
                    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid pyr");
                  }
                  if (0 < nhex) {
                    faceid_offset =
                         lVar3 * 7 + ntri * 0x18 + nqua * 4 * lVar3 + ntet * 5 * lVar3 +
                         npyr * 4 * lVar3 + npri * 5 * lVar3;
                    ref_grid = (REF_GRID)0xffffffffffffffff;
                    uVar1 = ref_part_bin_ugrid_cell
                                      ((REF_CELL)ref_node->unused_global,nhex,_instrument,ntri,
                                       (FILE *)nnode,faceid_offset,-1,file._4_4_,(REF_BOOL)file);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x5c0,"ref_part_bin_ugrid",(ulong)uVar1,"pri");
                      return uVar1;
                    }
                  }
                  if (local_98 != 0) {
                    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid pri");
                  }
                  if (0 < conn_offset) {
                    faceid_offset =
                         lVar3 * 7 + ntri * 0x18 + nqua * 4 * lVar3 + ntet * 5 * lVar3 +
                         npyr * 4 * lVar3 + npri * 5 * lVar3 + nhex * 6 * lVar3;
                    ref_grid = (REF_GRID)0xffffffffffffffff;
                    uVar1 = ref_part_bin_ugrid_cell
                                      ((REF_CELL)ref_node->old_n_global,conn_offset,_instrument,ntri
                                       ,(FILE *)nnode,faceid_offset,-1,file._4_4_,(REF_BOOL)file);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x5ce,"ref_part_bin_ugrid",(ulong)uVar1,"hex");
                      return uVar1;
                    }
                  }
                  if (local_98 != 0) {
                    ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid hex");
                  }
                  if (*(int *)(*(long *)ref_node + 4) == 0) {
                    iVar2 = fclose((FILE *)nnode);
                    if ((long)iVar2 != 0) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x5d2,"ref_part_bin_ugrid","close file",0,(long)iVar2);
                      return 1;
                    }
                  }
                  uVar1 = ref_node_ghost_real(_instrument);
                  if (uVar1 == 0) {
                    if (local_98 != 0) {
                      ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid ghost");
                    }
                    uVar1 = ref_grid_inward_boundary_orientation((REF_GRID)ref_node);
                    if (uVar1 == 0) {
                      if (local_98 != 0) {
                        ref_mpi_stopwatch_stop(*(REF_MPI *)ref_node,"ugrid volume");
                      }
                      ref_grid_ptr_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x5da,"ref_part_bin_ugrid",(ulong)uVar1,"inward boundary orientation")
                      ;
                      ref_grid_ptr_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x5d6,"ref_part_bin_ugrid",(ulong)uVar1,"ghost real");
                    ref_grid_ptr_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x584,"ref_part_bin_ugrid",(ulong)uVar1,"part node");
                  ref_grid_ptr_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0x57e,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
                ref_grid_ptr_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0x57d,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
              ref_grid_ptr_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0x57c,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
            ref_grid_ptr_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x57b,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
          ref_grid_ptr_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0x57a,"ref_part_bin_ugrid",(ulong)uVar1,"bcast");
        ref_grid_ptr_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x579,
             "ref_part_bin_ugrid",(ulong)uVar1,"bcast");
      ref_grid_ptr_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x578,
           "ref_part_bin_ugrid",(ulong)uVar1,"bcast");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid(REF_GRID *ref_grid_ptr,
                                             REF_MPI ref_mpi,
                                             const char *filename,
                                             REF_BOOL swap_endian,
                                             REF_BOOL sixty_four_bit) {
  FILE *file;
  REF_LONG nnode, ntri, nqua, ntet, npyr, npri, nhex;

  REF_FILEPOS conn_offset, faceid_offset;

  REF_GRID ref_grid;
  REF_NODE ref_node;

  REF_INT version = 0;
  REF_BOOL instrument = (ref_mpi_timing(ref_mpi) > 0);

  REF_INT single;
  REF_FILEPOS ibyte;
  ibyte = (sixty_four_bit ? 8 : 4);

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (instrument) ref_mpi_stopwatch_start(ref_grid_mpi(ref_grid));

  /* header */

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    if (sixty_four_bit) {
      RES(1, fread(&nnode, sizeof(REF_LONG), 1, file), "nnode");
      RES(1, fread(&ntri, sizeof(REF_LONG), 1, file), "ntri");
      RES(1, fread(&nqua, sizeof(REF_LONG), 1, file), "nqua");
      RES(1, fread(&ntet, sizeof(REF_LONG), 1, file), "ntet");
      RES(1, fread(&npyr, sizeof(REF_LONG), 1, file), "npyr");
      RES(1, fread(&npri, sizeof(REF_LONG), 1, file), "npri");
      RES(1, fread(&nhex, sizeof(REF_LONG), 1, file), "nhex");

      if (swap_endian) {
        SWAP_LONG(nnode);
        SWAP_LONG(ntri);
        SWAP_LONG(nqua);
        SWAP_LONG(ntet);
        SWAP_LONG(npyr);
        SWAP_LONG(npri);
        SWAP_LONG(nhex);
      }
    } else {
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nnode");
      if (swap_endian) SWAP_INT(single);
      nnode = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "ntri");
      if (swap_endian) SWAP_INT(single);
      ntri = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nqua");
      if (swap_endian) SWAP_INT(single);
      nqua = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "ntet");
      if (swap_endian) SWAP_INT(single);
      ntet = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "npyr");
      if (swap_endian) SWAP_INT(single);
      npyr = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "npri");
      if (swap_endian) SWAP_INT(single);
      npri = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nhex");
      if (swap_endian) SWAP_INT(single);
      nhex = single;
    }
  }

  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nnode, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ntri, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nqua, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ntet, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &npyr, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &npri, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nhex, 1, REF_LONG_TYPE), "bcast");

  if (instrument)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid header");

  RSS(ref_part_node(file, swap_endian, version, REF_FALSE, ref_node, nnode),
      "part node");
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid nodes");

  if (0 < ntri) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3);
    faceid_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                    (REF_FILEPOS)ntri * 3 * ibyte +
                    (REF_FILEPOS)nqua * 4 * ibyte;
    RSS(ref_part_bin_ugrid_cell(ref_grid_tri(ref_grid), ntri, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "tri");
  }

  if (0 < nqua) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 3 * ibyte;
    faceid_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                    (REF_FILEPOS)ntri * 4 * ibyte +
                    (REF_FILEPOS)nqua * 4 * ibyte;
    RSS(ref_part_bin_ugrid_cell(ref_grid_qua(ref_grid), nqua, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "qua");
  }

  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid bound");

  if (0 < ntet) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte + (REF_FILEPOS)nqua * 5 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_tet(ref_grid), ntet, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "tet");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid tet");

  if (0 < npyr) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte + (REF_FILEPOS)ntet * 4 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_pyr(ref_grid), npyr, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "pyr");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid pyr");

  if (0 < npri) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte +
                  (REF_FILEPOS)ntet * 4 * ibyte + (REF_FILEPOS)npyr * 5 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_pri(ref_grid), npri, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "pri");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid pri");

  if (0 < nhex) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte +
                  (REF_FILEPOS)ntet * 4 * ibyte +
                  (REF_FILEPOS)npyr * 5 * ibyte + (REF_FILEPOS)npri * 6 * ibyte;
    faceid_offset = REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_hex(ref_grid), nhex, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "hex");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid hex");

  if (ref_grid_once(ref_grid)) REIS(0, fclose(file), "close file");

  /* ghost xyz */

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid ghost");

  RSS(ref_grid_inward_boundary_orientation(ref_grid),
      "inward boundary orientation");

  if (instrument)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid volume");

  return REF_SUCCESS;
}